

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  MRIStepInnerStepper p_Var1;
  MRIStepInnerResetFn p_Var2;
  ARKodeMem pAVar3;
  int iVar4;
  ulong uVar5;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_48;
  realtype *local_40;
  ARKodeMRIStepMem local_38;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  local_40 = dsmPtr;
  iVar4 = mriStep_AccessStepMem(arkode_mem,"mriStep_TakeStep",&local_48,&local_38);
  pAVar3 = local_48;
  if (iVar4 != 0) {
    return iVar4;
  }
  if ((local_38->NLS != (SUNNonlinearSolver)0x0) &&
     (local_38->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    N_VConst(0.0,local_48->tempv3);
    iVar4 = SUNNonlinSolSetup(local_38->NLS,pAVar3->tempv3,pAVar3);
    if (iVar4 < 0) {
      return -0x1e;
    }
    if (iVar4 != 0) {
      return -0x1f;
    }
  }
  pAVar3 = local_48;
  if (1 < local_38->stages) {
    uVar5 = 1;
    do {
      pAVar3->tcur = local_38->MRIC->c[uVar5] * pAVar3->h + pAVar3->tn;
      iVar4 = (int)uVar5;
      if (pAVar3->report != 0) {
        fprintf((FILE *)pAVar3->diagfp,"MRIStep  step  %li  %.16g  %i  %.16g\n",pAVar3->nst,
                uVar5 & 0xffffffff);
      }
      switch(local_38->stagetypes[uVar5]) {
      case 0:
        iVar4 = mriStep_StageERKFast(pAVar3,local_38,iVar4);
        break;
      case 1:
        iVar4 = mriStep_StageERKNoFast(pAVar3,local_38,iVar4);
        break;
      case 2:
        iVar4 = mriStep_StageDIRKNoFast(pAVar3,local_38,iVar4,nflagPtr);
        break;
      case 3:
        iVar4 = -0x29;
        arkProcessError(pAVar3,-0x29,"ARKode::MRIStep","mriStep_StageDIRKFast",
                        "This routine is not yet implemented.");
        break;
      default:
        iVar4 = 0;
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      if ((pAVar3->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar4 = (*pAVar3->ProcessStage)(pAVar3->tcur,pAVar3->ycur,pAVar3->user_data), iVar4 != 0))
      {
        return -0x26;
      }
      if ((local_38->stagetypes[uVar5] != 0) || (pAVar3->ProcessStage != (ARKPostProcessFn)0x0)) {
        p_Var1 = local_38->stepper;
        if (p_Var1 == (MRIStepInnerStepper)0x0) {
          return -0x22;
        }
        if (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0) {
          return -0x22;
        }
        p_Var2 = p_Var1->ops->reset;
        if (p_Var2 != (MRIStepInnerResetFn)0x0) {
          iVar4 = (*p_Var2)(p_Var1,pAVar3->tcur,pAVar3->ycur);
          p_Var1->last_flag = iVar4;
          if (iVar4 != 0) {
            return -0x22;
          }
        }
      }
      if (((long)uVar5 < (long)local_38->stages + -1) && (-1 < (long)local_38->stage_map[uVar5])) {
        if (local_38->explicit_rhs != 0) {
          iVar4 = (*local_38->fse)(pAVar3->tcur,pAVar3->ycur,
                                   local_38->Fse[local_38->stage_map[uVar5]],pAVar3->user_data);
          local_38->nfse = local_38->nfse + 1;
          if (iVar4 < 0) {
            return -8;
          }
          if (iVar4 != 0) {
            return -0xb;
          }
        }
        if (local_38->implicit_rhs != 0) {
          if ((local_38->deduce_rhs == 0) || (local_38->stagetypes[uVar5] != 2)) {
            iVar4 = (*local_38->fsi)(pAVar3->tcur,pAVar3->ycur,
                                     local_38->Fsi[local_38->stage_map[uVar5]],pAVar3->user_data);
            local_38->nfsi = local_38->nfsi + 1;
          }
          else {
            N_VLinearSum(1.0 / local_38->gamma,local_38->zcor,-1.0 / local_38->gamma,local_38->sdata
                         ,local_38->Fsi[local_38->stage_map[uVar5]]);
            iVar4 = 0;
          }
          if (iVar4 < 0) {
            return -8;
          }
          if (iVar4 != 0) {
            return -0xb;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)local_38->stages);
  }
  if (local_48->report != 0) {
    fprintf((FILE *)local_48->diagfp,"MRIStep  etest  %li  %.16g  %.16g\n",local_48->h,*local_40,
            local_48->nst);
  }
  return 0;
}

Assistant:

int mriStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  ARKodeMem ark_mem;           /* outer ARKode memory        */
  ARKodeMRIStepMem step_mem;   /* outer stepper memory       */
  int is;                      /* current stage index        */
  int retval;                  /* reusable return flag       */

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr = ZERO;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage 0 solution:\n");
    N_VPrint(ark_mem->ycur);
    if (step_mem->explicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fe[0]:\n");
      N_VPrint(step_mem->Fse[0]);
    }
    if (step_mem->implicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fi[0]:\n");
      N_VPrint(step_mem->Fsi[0]);
    }
#endif

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      N_VConst(ZERO, ark_mem->tempv3);   /* set guess to 0 for predictor-corrector form */
      retval = SUNNonlinSolSetup(step_mem->NLS, ark_mem->tempv3, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Loop over remaining stages */
  for (is = 1; is < step_mem->stages; is++) {

    /* Set current stage time  */
    ark_mem->tcur = ark_mem->tn + step_mem->MRIC->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ------------------------------------"
           "----------------------------------------\n");
    printf("    MRIStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "MRIStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::mriStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Determine current stage type, and call corresponding routine; the
       vector ark_mem->ycur stores the previous stage solution on input, and
       should store the result of this stage solution on output. */
    switch (step_mem->stagetypes[is]) {
    case(MRISTAGE_ERK_FAST):
      retval = mriStep_StageERKFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_ERK_NOFAST):
      retval = mriStep_StageERKNoFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_DIRK_NOFAST):
      retval = mriStep_StageDIRKNoFast(ark_mem, step_mem, is, nflagPtr);
      break;
    case(MRISTAGE_DIRK_FAST):
      retval = mriStep_StageDIRKFast(ark_mem, step_mem, is, nflagPtr);
      break;
    }
    if (retval != ARK_SUCCESS)  return(retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage %i solution:\n",is);
    N_VPrint(ark_mem->ycur);
#endif

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* conditionally reset the inner integrator with the modified stage solution */
    if ( (step_mem->stagetypes[is] != MRISTAGE_ERK_FAST) ||
         (ark_mem->ProcessStage != NULL) ) {
      retval = mriStepInnerStepper_Reset(step_mem->stepper,
                                         ark_mem->tcur, ark_mem->ycur);
      if (retval != ARK_SUCCESS)  return(ARK_INNERSTEP_FAIL);
    }

    /* Compute updated slow RHS except at last stage which is the new solution.
     * The new solution RHS evaluation happens in arkCompleteStep */
    if (is < step_mem->stages - 1 && step_mem->stage_map[is] > -1) {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs) {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[step_mem->stage_map[is]],
                               ark_mem->user_data);
        step_mem->nfse++;
        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fse[step_mem->stage_map[is]]);
#endif
      }

      /* store implicit slow rhs  */
      if (step_mem->implicit_rhs) {
        if (!step_mem->deduce_rhs ||
            (step_mem->stagetypes[is] != MRISTAGE_DIRK_NOFAST)) {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[step_mem->stage_map[is]],
                                 ark_mem->user_data);
          step_mem->nfsi++;
        } else {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[step_mem->stage_map[is]]);
        }

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fi[%i]:\n",is);
        N_VPrint(step_mem->Fsi[step_mem->stage_map[is]]);
#endif
      }
    } /* compute slow RHS */
  } /* loop over stages */

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "MRIStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}